

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

int __thiscall
google::protobuf::RepeatedField<unsigned_int>::SpaceUsedExcludingSelf
          (RepeatedField<unsigned_int> *this)

{
  LogMessage *other;
  ulong uVar1;
  LogFinisher local_49;
  LogMessage local_48;
  
  uVar1 = 0;
  if (0 < (long)this->total_size_) {
    uVar1 = (long)this->total_size_ * 4 + 8;
  }
  if ((int)(uVar1 >> 0x1f) != 0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.h"
               ,0x80);
    other = internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: (size) <= (static_cast<size_t>(2147483647)): ");
    internal::LogFinisher::operator=(&local_49,other);
    internal::LogMessage::~LogMessage(&local_48);
  }
  return (int)uVar1;
}

Assistant:

inline size_t RepeatedField<Element>::SpaceUsedExcludingSelfLong() const {
  return total_size_ > 0 ? (total_size_ * sizeof(Element) + kRepHeaderSize) : 0;
}